

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O2

IAnimatedMesh * __thiscall
irr::scene::CXMeshFileLoader::createMesh(CXMeshFileLoader *this,IReadFile *file)

{
  long *plVar1;
  long lVar2;
  void *pvVar3;
  pointer ppSVar4;
  SXMesh *this_00;
  bool bVar5;
  CSkinnedMesh *this_01;
  u32 i;
  ulong uVar6;
  
  if (file != (IReadFile *)0x0) {
    this_01 = (CSkinnedMesh *)operator_new(0xd8);
    CSkinnedMesh::CSkinnedMesh(this_01);
    *(CSkinnedMesh **)&(this->super_IMeshLoader).field_0x8 = this_01;
    bVar5 = load(this,file);
    plVar1 = *(long **)&(this->super_IMeshLoader).field_0x8;
    lVar2 = *plVar1;
    if (bVar5) {
      (**(code **)(lVar2 + 0xe8))();
    }
    else {
      IReferenceCounted::drop((IReferenceCounted *)((long)plVar1 + *(long *)(lVar2 + -0x18)));
      *(undefined8 *)&(this->super_IMeshLoader).field_0x8 = 0;
    }
    this->CurFrame = (SJoint *)0x0;
    this->BinaryNumCount = 0;
    *(undefined8 *)&(this->super_IMeshLoader).field_0x18 = 0;
    this->End = (c8 *)0x0;
    this->MajorVersion = 0;
    this->MinorVersion = 0;
    this->BinaryFormat = false;
    this->FloatSize = '\0';
    pvVar3 = *(void **)&(this->super_IMeshLoader).field_0x10;
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
    *(undefined8 *)&(this->super_IMeshLoader).field_0x10 = 0;
    for (uVar6 = 0;
        ppSVar4 = (this->Meshes).m_data.
                  super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < ((ulong)((long)(this->Meshes).m_data.
                               super__Vector_base<irr::scene::CXMeshFileLoader::SXMesh_*,_std::allocator<irr::scene::CXMeshFileLoader::SXMesh_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4) >> 3 &
                0xffffffff); uVar6 = uVar6 + 1) {
      this_00 = ppSVar4[uVar6];
      if (this_00 != (SXMesh *)0x0) {
        SXMesh::~SXMesh(this_00);
      }
      operator_delete(this_00,0x158);
    }
    core::array<irr::scene::CXMeshFileLoader::SXMesh_*>::clear(&this->Meshes);
    return *(IAnimatedMesh **)&(this->super_IMeshLoader).field_0x8;
  }
  return (IAnimatedMesh *)0x0;
}

Assistant:

IAnimatedMesh *CXMeshFileLoader::createMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

#ifdef _XREADER_DEBUG
	u32 time = os::Timer::getRealTime();
#endif

	AnimatedMesh = new CSkinnedMesh();

	if (load(file)) {
		AnimatedMesh->finalize();
	} else {
		AnimatedMesh->drop();
		AnimatedMesh = 0;
	}
#ifdef _XREADER_DEBUG
	time = os::Timer::getRealTime() - time;
	core::stringc tmpString = "Time to load ";
	tmpString += BinaryFormat ? "binary" : "ascii";
	tmpString += " X file: ";
	tmpString += time;
	tmpString += "ms";
	os::Printer::log(tmpString.c_str());
#endif
	// Clear up

	MajorVersion = 0;
	MinorVersion = 0;
	BinaryFormat = 0;
	BinaryNumCount = 0;
	FloatSize = 0;
	P = 0;
	End = 0;
	CurFrame = 0;

	delete[] Buffer;
	Buffer = 0;

	for (u32 i = 0; i < Meshes.size(); ++i)
		delete Meshes[i];
	Meshes.clear();

	return AnimatedMesh;
}